

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kvm.cpp
# Opt level: O1

Value * __thiscall
Kvm::makeOutputPort(Kvm *this,
                   unique_ptr<std::basic_ofstream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
                   *output)

{
  basic_ofstream<char,_std::char_traits<char>_> *pbVar1;
  _func_int **pp_Var2;
  Value *pVVar3;
  
  pVVar3 = Kgc::allocValue(&this->gc_,OUTPUT_PORT);
  pbVar1 = (output->_M_t).
           super___uniq_ptr_impl<std::basic_ofstream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_std::basic_ofstream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
           .super__Head_base<0UL,_std::basic_ofstream<char,_std::char_traits<char>_>_*,_false>.
           _M_head_impl;
  (output->_M_t).
  super___uniq_ptr_impl<std::basic_ofstream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::basic_ofstream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
  .super__Head_base<0UL,_std::basic_ofstream<char,_std::char_traits<char>_>_*,_false>._M_head_impl =
       (basic_ofstream<char,_std::char_traits<char>_> *)0x0;
  pp_Var2 = pVVar3[1]._vptr_Value;
  pVVar3[1]._vptr_Value = (_func_int **)pbVar1;
  if (pp_Var2 != (_func_int **)0x0) {
    (**(code **)(*pp_Var2 + 8))();
  }
  return pVVar3;
}

Assistant:

const Value* Kvm::makeOutputPort(std::unique_ptr<std::ofstream> output)
{
    OutputPort *op = static_cast<OutputPort *>(gc_.allocValue(ValueType::OUTPUT_PORT));
    op->output = std::move(output);
    return op;
}